

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::arg_integer(Simulator *this,PCode *code)

{
  simulator_error *this_00;
  _Elt_pointer pSVar1;
  allocator local_fd;
  int local_fc;
  Symbol local_f8;
  StackSymbol back;
  
  pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar1 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar1 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  StackSymbol::StackSymbol(&back,pSVar1 + -1);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  if (back.type_ == kReal) {
    local_fc = (int)back.value_.real_value;
    local_fd = (allocator)0x1;
    Symbol::Symbol(&local_f8,&code->first_,&local_fc,(bool *)&local_fd);
    ScopeTree::define(&this->tree_,&local_f8);
  }
  else {
    if (back.type_ != kInt) {
      this_00 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_fc = this->eip_;
      std::__cxx11::string::string((string *)&local_f8,anon_var_dwarf_ac62,&local_fd);
      simulator_error::simulator_error(this_00,&local_fc,&local_f8.name_);
      __cxa_throw(this_00,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    local_fc = back.value_.int_value;
    local_fd = (allocator)0x1;
    Symbol::Symbol(&local_f8,&code->first_,&local_fc,(bool *)&local_fd);
    ScopeTree::define(&this->tree_,&local_f8);
  }
  Symbol::~Symbol(&local_f8);
  this->eip_ = this->eip_ + 1;
  StackSymbol::UnionValue::~UnionValue(&back.value_);
  return;
}

Assistant:

void Simulator::arg_integer(const PCode &code) {
    StackSymbol back = stack_.back();
    stack_.pop_back();

    if (back.type() == StackSymbol::Type::kInt) {
        tree_.define(Symbol(code.first(), (int)back.int_value(), true));
    } else if (back.type() == StackSymbol::Type::kReal) {
        tree_.define(Symbol(code.first(), (int)back.real_value(), true));
    } else {
        throw simulator_error(eip(), "不支持的函数调用实参类型");
    }

    inc_eip();
}